

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::EmitterBeam::~EmitterBeam(EmitterBeam *this)

{
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EmitterBeam_00217a08;
  std::
  vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
  ::clear(&this->m_vTrackJamTargets);
  std::
  vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
  ::~vector(&this->m_vTrackJamTargets);
  JammingTechnique::~JammingTechnique(&this->m_JammingTechnique);
  BeamStatus::~BeamStatus(&this->m_BeamStatus);
  DataTypeBase::~DataTypeBase(&(this->m_FundamentalParameterData).super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&this->super_DataTypeBase);
  return;
}

Assistant:

EmitterBeam::~EmitterBeam()
{
    m_vTrackJamTargets.clear();
}